

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseRAPass::runLocalAllocator(BaseRAPass *this)

{
  ZoneVector<asmjit::v1_14::RABlock_*> *this_00;
  long lVar1;
  InstNode *pIVar2;
  RABlock *target;
  BaseBuilder *pBVar3;
  bool bVar4;
  Error EVar5;
  RABlock **ppRVar6;
  RASharedAssignment *pRVar7;
  InstNode *pIVar8;
  BaseNode *pBVar9;
  InstNode *pIVar10;
  uint uVar11;
  ulong i;
  BaseRAPass *ctx;
  RABlock *block;
  InstNode *node;
  int iVar12;
  InstNode *inst;
  RABlocks *successors;
  RALocalAllocator lra;
  RABlock *local_158;
  RALocalAllocator local_130;
  
  ctx = this;
  RALocalAllocator::RALocalAllocator(&local_130,this);
  EVar5 = RALocalAllocator::init(&local_130,(EVP_PKEY_CTX *)ctx);
  if (EVar5 == 0) {
    if (*(int *)&this->field_0xb8 != 0) {
      iVar12 = *(int *)&this->field_0xd8;
      ppRVar6 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[](&this->_blocks,0);
      block = *ppRVar6;
      if (((byte)block[0xc] & 2) == 0) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/rapass.cpp"
                   ,0x5d1,"block->isReachable()");
      }
      RALocalAllocator::makeInitialAssignment(&local_130);
      EVar5 = setBlockEntryAssignment(this,block,block,&local_130._curAssignment);
      if (EVar5 != 0) {
        return EVar5;
      }
      i = 0;
LAB_00121dfe:
      pIVar8 = *(InstNode **)(block + 0x10);
      pIVar10 = *(InstNode **)(block + 0x18);
      uVar11 = *(uint *)(block + 0xc);
      lVar1 = *(long *)pIVar8;
      pIVar2 = *(InstNode **)(pIVar10 + 8);
      if ((uVar11 >> 8 & 1) == 0) {
        pIVar10 = (InstNode *)0x0;
      }
      this_00 = (ZoneVector<asmjit::v1_14::RABlock_*> *)(block + 0x68);
      local_158 = (RABlock *)0x0;
      if (*(int *)(block + 0x70) != 0) {
        ppRVar6 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[](this_00,0);
        local_158 = *ppRVar6;
        uVar11 = *(uint *)(block + 0xc);
      }
      *(uint *)(block + 0xc) = uVar11 | 8;
      bVar4 = false;
      local_130._block = block;
      while (node = pIVar8, node != pIVar2) {
        pIVar8 = *(InstNode **)(node + 8);
        if (((byte)node[0x11] & 0x20) != 0) {
          if (node == pIVar10) {
            if (((byte)block[0xd] & 2) == 0) {
              if (*(uint *)(block + 0x70) < 2) {
                bVar4 = true;
                goto LAB_00121e92;
              }
              EVar5 = RALocalAllocator::allocJumpTable(&local_130,node,this_00,(RABlock *)0x0);
            }
            else {
              ppRVar6 = ZoneVector<asmjit::v1_14::RABlock_*>::last(this_00);
              target = *ppRVar6;
              ppRVar6 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[](this_00,0);
              EVar5 = RALocalAllocator::allocBranch(&local_130,node,target,*ppRVar6);
            }
          }
          else {
LAB_00121e92:
            EVar5 = RALocalAllocator::allocInst(&local_130,node);
            if (EVar5 != 0) {
              return EVar5;
            }
            if (node[0x10] == (InstNode)0x12) {
              EVar5 = (*(this->super_FuncPass).super_Pass._vptr_Pass[0xe])(this);
            }
            else {
              EVar5 = RALocalAllocator::spillAfterAllocation(&local_130,node);
            }
          }
          if (EVar5 != 0) {
            return EVar5;
          }
        }
      }
      if (local_158 != (RABlock *)0x0) {
        pBVar3 = (this->super_FuncPass).super_Pass._cb;
        pIVar8 = (InstNode *)&pBVar3->field_0x1a8;
        if (pIVar2 != (InstNode *)0x0) {
          pIVar8 = pIVar2;
        }
        pBVar9 = *(BaseNode **)pIVar8;
        if (bVar4) {
          pBVar9 = *(BaseNode **)pBVar9;
        }
        pBVar3->_cursor = pBVar9;
        if (*(PhysToWorkMap **)(local_158 + 200) == (PhysToWorkMap *)0x0) {
          if ((ulong)*(uint *)(local_158 + 0xb8) == 0xffffffff) {
            pRVar7 = (RASharedAssignment *)(local_158 + 0xbc);
          }
          else {
            pRVar7 = ZoneVector<asmjit::v1_14::RASharedAssignment>::operator[]
                               ((ZoneVector<asmjit::v1_14::RASharedAssignment> *)
                                (*(long *)local_158 + 0xe8),(ulong)*(uint *)(local_158 + 0xb8));
          }
          EVar5 = RALocalAllocator::spillScratchGpRegsBeforeEntry
                            (&local_130,pRVar7->_entryScratchGpRegs);
          if (EVar5 != 0) {
            return EVar5;
          }
          EVar5 = setBlockEntryAssignment(this,local_158,block,&local_130._curAssignment);
          if (EVar5 != 0) {
            return EVar5;
          }
          RAAssignment::copyFrom(&local_130._curAssignment,*(PhysToWorkMap **)(local_158 + 200));
        }
        else {
          EVar5 = RALocalAllocator::switchToAssignment
                            (&local_130,*(PhysToWorkMap **)(local_158 + 200),
                             (ZoneBitVector *)(local_158 + 0x78),
                             SUB41((*(uint *)(local_158 + 0xc) & 8) >> 3,0),false);
          if (EVar5 != 0) {
            return EVar5;
          }
        }
      }
      *(undefined8 *)(block + 0x10) = *(undefined8 *)(lVar1 + 8);
      pIVar8 = (InstNode *)&((this->super_FuncPass).super_Pass._cb)->field_0x1a8;
      if (pIVar2 != (InstNode *)0x0) {
        pIVar8 = pIVar2;
      }
      *(undefined8 *)(block + 0x18) = *(undefined8 *)pIVar8;
      iVar12 = iVar12 + -1;
      if (iVar12 != 0) {
        if ((local_158 == (RABlock *)0x0) || (block = local_158, ((byte)local_158[0xc] & 8) != 0)) {
          do {
            uVar11 = (int)i + 1;
            i = (ulong)uVar11;
            if (*(uint *)&this->field_0xb8 <= uVar11) {
              i = 0;
            }
            ppRVar6 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[](&this->_blocks,i);
            block = *ppRVar6;
          } while (((*(uint *)(block + 0xc) & 10) != 2) ||
                  (*(PhysToWorkMap **)(block + 200) == (PhysToWorkMap *)0x0));
          RALocalAllocator::replaceAssignment(&local_130,*(PhysToWorkMap **)(block + 200));
        }
        goto LAB_00121dfe;
      }
      Support::Array<unsigned_int,_4UL>::combine<asmjit::v1_14::Support::Or>
                (&(this->_clobberedRegs)._masks,&local_130._clobberedRegs._masks);
    }
    EVar5 = 0;
  }
  return EVar5;
}

Assistant:

Error BaseRAPass::runLocalAllocator() noexcept {
  RALocalAllocator lra(this);
  ASMJIT_PROPAGATE(lra.init());

  if (!blockCount())
    return kErrorOk;

  // The allocation is done when this reaches zero.
  uint32_t blocksRemaining = reachableBlockCount();

  // Current block.
  uint32_t blockId = 0;
  RABlock* block = _blocks[blockId];

  // The first block (entry) must always be reachable.
  ASMJIT_ASSERT(block->isReachable());

  // Assign function arguments for the initial block. The `lra` is valid now.
  lra.makeInitialAssignment();
  ASMJIT_PROPAGATE(setBlockEntryAssignment(block, block, lra._curAssignment));

  // The loop starts from the first block and iterates blocks in order, however, the algorithm also allows to jump to
  // any other block when finished if it's a jump target. In-order iteration just makes sure that all blocks are visited.
  for (;;) {
    BaseNode* first = block->first();
    BaseNode* last = block->last();
    BaseNode* terminator = block->hasTerminator() ? last : nullptr;

    BaseNode* beforeFirst = first->prev();
    BaseNode* afterLast = last->next();

    bool unconditionalJump = false;
    RABlock* consecutive = nullptr;

    if (block->hasSuccessors())
      consecutive = block->successors()[0];

    lra.setBlock(block);
    block->makeAllocated();

    BaseNode* node = first;
    while (node != afterLast) {
      BaseNode* next = node->next();
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();

        if (ASMJIT_UNLIKELY(inst == terminator)) {
          const RABlocks& successors = block->successors();
          if (block->hasConsecutive()) {
            ASMJIT_PROPAGATE(lra.allocBranch(inst, successors.last(), successors.first()));

            node = next;
            continue;
          }
          else if (successors.size() > 1) {
            RABlock* cont = block->hasConsecutive() ? successors.first() : nullptr;
            ASMJIT_PROPAGATE(lra.allocJumpTable(inst, successors, cont));

            node = next;
            continue;
          }
          else {
            // Otherwise this is an unconditional jump, special handling isn't required.
            unconditionalJump = true;
          }
        }

        ASMJIT_PROPAGATE(lra.allocInst(inst));
        if (inst->type() == NodeType::kInvoke)
          ASMJIT_PROPAGATE(emitPreCall(inst->as<InvokeNode>()));
        else
          ASMJIT_PROPAGATE(lra.spillAfterAllocation(inst));
      }
      node = next;
    }

    if (consecutive) {
      BaseNode* prev = afterLast ? afterLast->prev() : cc()->lastNode();
      cc()->_setCursor(unconditionalJump ? prev->prev() : prev);

      if (consecutive->hasEntryAssignment()) {
        ASMJIT_PROPAGATE(lra.switchToAssignment(consecutive->entryPhysToWorkMap(), consecutive->liveIn(), consecutive->isAllocated(), false));
      }
      else {
        ASMJIT_PROPAGATE(lra.spillRegsBeforeEntry(consecutive));
        ASMJIT_PROPAGATE(setBlockEntryAssignment(consecutive, block, lra._curAssignment));
        lra._curAssignment.copyFrom(consecutive->entryPhysToWorkMap());
      }
    }

    // Important as the local allocator can insert instructions before
    // and after any instruction within the basic block.
    block->setFirst(beforeFirst->next());
    block->setLast(afterLast ? afterLast->prev() : cc()->lastNode());

    if (--blocksRemaining == 0)
      break;

    // Switch to the next consecutive block, if any.
    if (consecutive) {
      block = consecutive;
      if (!block->isAllocated())
        continue;
    }

    // Get the next block.
    for (;;) {
      if (++blockId >= blockCount())
        blockId = 0;

      block = _blocks[blockId];
      if (!block->isReachable() || block->isAllocated() || !block->hasEntryAssignment())
        continue;

      break;
    }

    // If we switched to some block we have to update the local allocator.
    lra.replaceAssignment(block->entryPhysToWorkMap());
  }

  _clobberedRegs.op<Support::Or>(lra._clobberedRegs);
  return kErrorOk;
}